

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

optional<google::protobuf::io::Printer::AnnotationRecord> *
google::protobuf::io::anon_unknown_4::
LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
          (optional<google::protobuf::io::Printer::AnnotationRecord> *__return_storage_ptr__,
          string_view var,
          Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
          frames)

{
  basic_string_view<char,_std::char_traits<char>_> __args;
  bool bVar1;
  reference this;
  size_type local_38;
  size_t i;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames_local;
  string_view var_local;
  optional<google::protobuf::io::Printer::AnnotationRecord> *val;
  
  frames_local.len_ = var._M_len;
  frames_local.ptr_ = (pointer)frames.len_;
  i = (size_t)frames.ptr_;
  local_38 = absl::lts_20250127::
             Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
             ::size((Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                     *)&i);
  while( true ) {
    if (local_38 == 0) {
      std::optional<google::protobuf::io::Printer::AnnotationRecord>::optional
                (__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this = absl::lts_20250127::
           Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
           ::operator[]((Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                         *)&i,local_38 - 1);
    __args._M_str = var._M_str;
    __args._M_len = frames_local.len_;
    std::
    function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(__return_storage_ptr__,this,__args);
    bVar1 = std::optional<google::protobuf::io::Printer::AnnotationRecord>::has_value
                      (__return_storage_ptr__);
    if (bVar1) break;
    std::optional<google::protobuf::io::Printer::AnnotationRecord>::~optional
              (__return_storage_ptr__);
    local_38 = local_38 - 1;
  }
  return __return_storage_ptr__;
}

Assistant:

absl::optional<T> LookupInFrameStack(
    absl::string_view var,
    absl::Span<std::function<absl::optional<T>(absl::string_view)>> frames) {
  for (size_t i = frames.size(); i >= 1; --i) {
    auto val = frames[i - 1](var);
    if (val.has_value()) {
      return val;
    }
  }
  return absl::nullopt;
}